

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TDeletingArray<FxExpression_*,_FxExpression_*>::~TDeletingArray
          (TDeletingArray<FxExpression_*,_FxExpression_*> *this)

{
  FxExpression *pFVar1;
  uint i;
  ulong uVar2;
  
  for (uVar2 = 0; uVar2 < (this->super_TArray<FxExpression_*,_FxExpression_*>).Count;
      uVar2 = uVar2 + 1) {
    pFVar1 = (this->super_TArray<FxExpression_*,_FxExpression_*>).Array[uVar2];
    if (pFVar1 != (FxExpression *)0x0) {
      (*pFVar1->_vptr_FxExpression[1])();
    }
  }
  TArray<FxExpression_*,_FxExpression_*>::~TArray
            (&this->super_TArray<FxExpression_*,_FxExpression_*>);
  return;
}

Assistant:

~TDeletingArray<T, TT> ()
	{
		for (unsigned int i = 0; i < TArray<T,TT>::Size(); ++i)
		{
			if ((*this)[i] != NULL) 
				delete (*this)[i];
		}
	}